

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O0

Object<cmCMakePresetsGraph::ConfigurePreset> * __thiscall
cmJSONHelperBuilder::Object<cmCMakePresetsGraph::ConfigurePreset>::
Bind<cmCMakePresetsGraph::ConfigurePreset,std::map<std::__cxx11::string,std::optional<cmCMakePresetsGraph::CacheVariable>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<cmCMakePresetsGraph::CacheVariable>>>>,std::function<bool(std::map<std::__cxx11::string,std::optional<cmCMakePresetsGraph::CacheVariable>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<cmCMakePresetsGraph::CacheVariable>>>>&,Json::Value_const*,cmJSONState*)>>
          (Object<cmCMakePresetsGraph::ConfigurePreset> *this,string_view *name,
          offset_in_ConfigurePreset_to_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>_>_>_>
          member,function<bool_(std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>_>_>_>_&,_const_Json::Value_*,_cmJSONState_*)>
                 *func,bool required)

{
  Object<cmCMakePresetsGraph::ConfigurePreset> *pOVar1;
  anon_class_40_2_315d8239 local_78;
  MemberFunction local_50;
  byte local_29;
  function<bool_(std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>_>_>_>_&,_const_Json::Value_*,_cmJSONState_*)>
  *pfStack_28;
  bool required_local;
  function<bool_(std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>_>_>_>_&,_const_Json::Value_*,_cmJSONState_*)>
  *func_local;
  offset_in_ConfigurePreset_to_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>_>_>_>
  member_local;
  string_view *name_local;
  Object<cmCMakePresetsGraph::ConfigurePreset> *this_local;
  
  local_29 = required;
  pfStack_28 = func;
  func_local = (function<bool_(std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>_>_>_>_&,_const_Json::Value_*,_cmJSONState_*)>
                *)member;
  member_local = (offset_in_ConfigurePreset_to_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>_>_>_>
                  )name;
  name_local = (string_view *)this;
  std::
  function<bool_(std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>_>_>_>_&,_const_Json::Value_*,_cmJSONState_*)>
  ::function(&local_78.func,func);
  local_78.member =
       (offset_in_ConfigurePreset_to_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>_>_>_>
        )func_local;
  std::function<bool(cmCMakePresetsGraph::ConfigurePreset&,Json::Value_const*,cmJSONState*)>::
  function<cmJSONHelperBuilder::Object<cmCMakePresetsGraph::ConfigurePreset>::Bind<cmCMakePresetsGraph::ConfigurePreset,std::map<std::__cxx11::string,std::optional<cmCMakePresetsGraph::CacheVariable>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<cmCMakePresetsGraph::CacheVariable>>>>,std::function<bool(std::map<std::__cxx11::string,std::optional<cmCMakePresetsGraph::CacheVariable>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<cmCMakePresetsGraph::CacheVariable>>>>&,Json::Value_const*,cmJSONState*)>>(std::basic_string_view<char,std::char_traits<char>>const&,std::map<std::__cxx11::string,std::optional<cmCMakePresetsGraph::CacheVariable>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<cmCMakePresetsGraph::CacheVariable>>>>cmCMakePresetsGraph::ConfigurePreset::*,std::function<bool(std::map<std::__cxx11::string,std::optional<cmCMakePresetsGraph::CacheVariable>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<cmCMakePresetsGraph::CacheVariable>>>>&,Json::Value_const*,cmJSONState*)>,bool)::_lambda(cmCMakePresetsGraph::ConfigurePreset&,Json::Value_const*,cmJSONState*)_1_,void>
            ((function<bool(cmCMakePresetsGraph::ConfigurePreset&,Json::Value_const*,cmJSONState*)>
              *)&local_50,&local_78);
  pOVar1 = BindPrivate(this,name,&local_50,(bool)(local_29 & 1));
  std::function<bool_(cmCMakePresetsGraph::ConfigurePreset_&,_const_Json::Value_*,_cmJSONState_*)>::
  ~function(&local_50);
  Bind<cmCMakePresetsGraph::ConfigurePreset,std::map<std::__cxx11::string,std::optional<cmCMakePresetsGraph::CacheVariable>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<cmCMakePresetsGraph::CacheVariable>>>>,std::function<bool(std::map<std::__cxx11::string,std::optional<cmCMakePresetsGraph::CacheVariable>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<cmCMakePresetsGraph::CacheVariable>>>>&,Json::Value_const*,cmJSONState*)>>(std::basic_string_view<char,std::char_traits<char>>const&,std::map<std::__cxx11::string,std::optional<cmCMakePresetsGraph::CacheVariable>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<cmCMakePresetsGraph::CacheVariable>>>>cmCMakePresetsGraph::ConfigurePreset::*,std::function<bool(std::map<std::__cxx11::string,std::optional<cmCMakePresetsGraph::CacheVariable>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<cmCMakePresetsGraph::CacheVariable>>>>&,Json::Value_const*,cmJSONState*)>,bool)
  ::{lambda(cmCMakePresetsGraph::ConfigurePreset&,Json::Value_const*,cmJSONState*)#1}::
  ~basic_string_view((_lambda_cmCMakePresetsGraph__ConfigurePreset__Json__Value_const__cmJSONState___1_
                      *)&local_78);
  return pOVar1;
}

Assistant:

Object& Bind(const cm::string_view& name, M U::*member, F func,
                 bool required = true)
    {
      return this->BindPrivate(
        name,
        [func, member](T& out, const Json::Value* value, cmJSONState* state)
          -> bool { return func(out.*member, value, state); },
        required);
    }